

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

void server_poll_cb(uv_poll_t *handle,int status,int events)

{
  uv__queue **ppuVar1;
  uv_poll_t *puVar2;
  int iVar3;
  uint uVar4;
  connection_context_t *handle_00;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  uv_loop_t *loop;
  void *pvVar7;
  ssize_t sVar8;
  int *piVar9;
  uint extraout_EDX;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  uv_handle_t *handle_01;
  long *plVar13;
  code **ppcVar14;
  void *pvVar15;
  int64_t eval_b;
  int64_t eval_a;
  socklen_t addr_len;
  sockaddr_in addr;
  code *pcStack_d0;
  undefined8 uStack_c8;
  long lStack_c0;
  uv_loop_t *puStack_b8;
  code *pcStack_b0;
  void *pvStack_a0;
  void *pvStack_98;
  uv_loop_t *puStack_90;
  undefined8 uStack_60;
  undefined1 auStack_58 [16];
  uv__queue *local_30;
  uv_handle_t *local_28;
  socklen_t local_1c;
  sockaddr local_18;
  
  puVar6 = (uv_loop_t *)handle->data;
  local_1c = 0x10;
  iVar3 = accept(*(int *)&(puVar6->watcher_queue).prev,&local_18,&local_1c);
  local_28 = (uv_handle_t *)(long)iVar3;
  local_30 = (uv__queue *)0x0;
  if ((long)local_28 < 0) {
    server_poll_cb_cold_2();
  }
  else {
    handle_00 = create_connection_context(iVar3,1);
    handle_00->events = 7;
    iVar3 = uv_poll_start(&handle_00->poll_handle,7,connection_poll_cb);
    local_28 = (uv_handle_t *)(long)iVar3;
    local_30 = (uv__queue *)0x0;
    if (local_28 == (uv_handle_t *)0x0) {
      iVar3 = *(int *)((long)&(puVar6->watcher_queue).prev + 4) + 1;
      *(int *)((long)&(puVar6->watcher_queue).prev + 4) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)&(puVar6->watcher_queue).prev);
        uv_close((uv_handle_t *)puVar6,server_close_cb);
      }
      return;
    }
  }
  iVar3 = (int)&local_28;
  uVar12 = SUB84(&local_30,0);
  server_poll_cb_cold_1();
  iVar10 = (int)&uStack_60;
  auStack_58._8_8_ = puVar6;
  puVar5 = (uv_loop_t *)malloc(0x130);
  if (puVar5 == (uv_loop_t *)0x0) {
    create_connection_context_cold_3();
LAB_001b2972:
    create_connection_context_cold_1();
  }
  else {
    *(int *)&(puVar5->wq_async).handle_queue.prev = iVar3;
    *(undefined4 *)&(puVar5->wq_async).async_cb = uVar12;
    (puVar5->wq_async).next_closing = (uv_handle_t *)0x0;
    *(undefined8 *)&(puVar5->wq_async).flags = 0;
    *(undefined8 *)((long)&(puVar5->wq_async).async_cb + 4) = 0;
    *(undefined8 *)((long)&(puVar5->wq_async).queue.next + 4) = 0;
    *(undefined8 *)((long)&(puVar5->wq_async).queue.prev + 4) = 0;
    puVar6 = uv_default_loop();
    iVar3 = uv_poll_init(puVar6,(uv_poll_t *)puVar5,iVar3);
    piVar9 = (int *)((long)&(puVar5->wq_async).async_cb + 4);
    *piVar9 = *piVar9 + 1;
    puVar5->data = puVar5;
    auStack_58._0_8_ = SEXT48(iVar3);
    uStack_60._0_4_ = 0;
    uStack_60._4_4_ = 0;
    puVar6 = puVar5;
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_001b2972;
    loop = uv_default_loop();
    iVar3 = uv_timer_init(loop,(uv_timer_t *)&(puVar5->watcher_queue).prev);
    piVar9 = (int *)((long)&(puVar5->wq_async).async_cb + 4);
    *piVar9 = *piVar9 + 1;
    (puVar5->watcher_queue).prev = (uv__queue *)puVar5;
    auStack_58._0_8_ = SEXT48(iVar3);
    uStack_60._0_4_ = 0;
    uStack_60._4_4_ = 0;
    if ((void *)auStack_58._0_8_ == (void *)0x0) {
      return;
    }
  }
  puVar5 = (uv_loop_t *)auStack_58;
  create_connection_context_cold_2();
  puVar2 = (uv_poll_t *)puVar5->data;
  pvStack_98 = (void *)(long)iVar10;
  pvStack_a0 = (void *)0x0;
  puStack_90 = puVar6;
  if (pvStack_98 == (void *)0x0) {
    uVar11 = *(uint *)((long)&puVar2[2].handle_queue.next + 4);
    if ((uVar11 & extraout_EDX) == 0) goto LAB_001b3022;
    if ((~uVar11 & extraout_EDX) != 0) goto LAB_001b3027;
    if ((extraout_EDX & 1) == 0) goto switchD_001b2ba0_caseD_4;
    pcStack_b0 = (code *)0x1b2b64;
    iVar3 = rand();
    switch(iVar3 % 7) {
    case 0:
    case 1:
      do {
        pcStack_b0 = (code *)0x1b2bbf;
        sVar8 = recv(puVar2[1].io_watcher.fd,connection_poll_cb::buffer,0x4a,0);
        iVar3 = (int)sVar8;
        if (iVar3 != -1) break;
        pcStack_b0 = (code *)0x1b2bcd;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      pvStack_98 = (void *)(long)iVar3;
      pvStack_a0 = (void *)0x0;
      if (-1 < (long)pvStack_98) {
        if (iVar3 < 1) goto LAB_001b2d1a;
        puVar2[2].data = (void *)((long)puVar2[2].data + (long)pvStack_98);
        break;
      }
      goto LAB_001b304f;
    case 2:
    case 3:
      do {
        while( true ) {
          pcStack_b0 = (code *)0x1b2cd5;
          sVar8 = recv(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_1,0x3a3,0);
          uVar4 = (uint)sVar8;
          if (uVar4 == 0xffffffff) break;
          if ((int)uVar4 < 1) {
            if (uVar4 == 0) goto LAB_001b2d1a;
            pcStack_b0 = (code *)0x1b2d01;
            piVar9 = __errno_location();
            iVar3 = *piVar9;
            goto LAB_001b2d03;
          }
          puVar2[2].data = (void *)((long)puVar2[2].data + (ulong)(uVar4 & 0x7fffffff));
        }
        pcStack_b0 = (code *)0x1b2cf1;
        piVar9 = __errno_location();
        iVar3 = *piVar9;
      } while (iVar3 == 4);
LAB_001b2d03:
      if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
        pcStack_b0 = (code *)0x1b2d1a;
        connection_poll_cb_cold_3();
LAB_001b2d1a:
        *(undefined4 *)&puVar2[2].close_cb = 1;
        uVar11 = uVar11 & 0xfffffffe;
      }
      break;
    case 4:
      break;
    case 5:
      uVar11 = uVar11 & 0xfffffffe;
      pcStack_b0 = (code *)0x1b2d3f;
      iVar3 = uv_is_active((uv_handle_t *)(puVar2 + 1));
      if (iVar3 == 0) {
        *(undefined4 *)&puVar2[2].handle_queue.prev = 1;
        pcStack_b0 = (code *)0x1b2e14;
        uv_timer_start((uv_timer_t *)(puVar2 + 1),delay_timer_cb,10,0);
      }
      else {
        ppuVar1 = &puVar2[2].handle_queue.prev;
        *(byte *)ppuVar1 = *(byte *)ppuVar1 | 1;
      }
      break;
    case 6:
      pcStack_b0 = (code *)0x1b2d6b;
      uv_poll_start(puVar2,2,connection_poll_cb);
      pcStack_b0 = (code *)0x1b2d7b;
      uv_poll_start(puVar2,1,connection_poll_cb);
      *(undefined4 *)((long)&puVar2[2].handle_queue.next + 4) = 1;
      break;
    default:
      goto switchD_001b2ba0_default;
    }
switchD_001b2ba0_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_001b2c49_caseD_4;
    if ((puVar2[2].loop < (uv_loop_t *)0x10000) &&
       ((test_mode != '\x01' || (puVar2[2].type == UV_UNKNOWN_HANDLE)))) {
      pcStack_b0 = (code *)0x1b2c0d;
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        pvVar7 = (void *)(0x10000 - (long)puVar2[2].loop);
        pvVar15 = (void *)0x67;
        if (pvVar7 < (void *)0x67) {
          pvVar15 = pvVar7;
        }
        pvStack_a0 = (void *)0x0;
        pvStack_98 = pvVar15;
        if (0 < (long)pvVar15) {
          do {
            pcStack_b0 = (code *)0x1b2c9e;
            sVar8 = send(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_2,(size_t)pvVar15,0);
            uVar4 = (uint)sVar8;
            if (uVar4 != 0xffffffff) {
              if (-1 < (int)uVar4) {
                pvStack_98 = (void *)(ulong)(uVar4 & 0x7fffffff);
                pvStack_a0 = (void *)0x0;
                if (pvStack_98 == (void *)0x0) goto LAB_001b308b;
                puVar2[2].loop =
                     (uv_loop_t *)((long)pvStack_98 + (long)((puVar2[2].loop)->reserved + -7));
                valid_writable_wakeups = valid_writable_wakeups + 1;
                goto switchD_001b2c49_caseD_4;
              }
              pcStack_b0 = (code *)0x1b2f9e;
              piVar9 = __errno_location();
              iVar3 = *piVar9;
              break;
            }
            pcStack_b0 = (code *)0x1b2cac;
            piVar9 = __errno_location();
            iVar3 = *piVar9;
          } while (iVar3 == 4);
          if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
            pcStack_b0 = (code *)0x1b2faf;
            connection_poll_cb_cold_15();
LAB_001b2faf:
            pcStack_b0 = (code *)0x1b2fb4;
            piVar9 = __errno_location();
            iVar3 = *piVar9;
            goto LAB_001b2fb6;
          }
LAB_001b2fc4:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        goto LAB_001b3063;
      case 2:
      case 3:
        pvVar15 = (void *)(0x10000 - (long)puVar2[2].loop);
        if ((void *)0x4d1 < pvVar15) {
          pvVar15 = (void *)0x4d2;
        }
        pvStack_a0 = (void *)0x0;
        pvStack_98 = pvVar15;
        if ((long)pvVar15 < 1) goto LAB_001b3072;
        do {
          pcStack_b0 = (code *)0x1b2ddd;
          sVar8 = send(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_3,(size_t)pvVar15,0);
          uVar4 = (uint)sVar8;
          if (uVar4 != 0xffffffff) {
            if ((int)uVar4 < 0) goto LAB_001b2faf;
            pvStack_98 = (void *)(ulong)(uVar4 & 0x7fffffff);
            pvStack_a0 = (void *)0x0;
            if (pvStack_98 == (void *)0x0) goto LAB_001b309a;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            puVar6 = (uv_loop_t *)((long)pvStack_98 + (long)puVar2[2].loop);
            puVar2[2].loop = puVar6;
            goto joined_r0x001b2e9b;
          }
          pcStack_b0 = (code *)0x1b2de7;
          piVar9 = __errno_location();
          iVar3 = *piVar9;
        } while (iVar3 == 4);
LAB_001b2fb6:
        if ((iVar3 == 0xb) || (iVar3 == 0x73)) goto LAB_001b2fc4;
        goto LAB_001b3086;
      case 4:
        break;
      case 5:
        uVar11 = uVar11 & 0xfffffffd;
        pcStack_b0 = (code *)0x1b2f51;
        iVar3 = uv_is_active((uv_handle_t *)(puVar2 + 1));
        if (iVar3 == 0) {
          *(undefined4 *)&puVar2[2].handle_queue.prev = 2;
          pcStack_b0 = (code *)0x1b2ff0;
          uv_timer_start((uv_timer_t *)(puVar2 + 1),delay_timer_cb,100,0);
        }
        else {
          ppuVar1 = &puVar2[2].handle_queue.prev;
          *(byte *)ppuVar1 = *(byte *)ppuVar1 | 2;
        }
        break;
      case 6:
        pcStack_b0 = (code *)0x1b2f79;
        uv_poll_start(puVar2,1,connection_poll_cb);
        pcStack_b0 = (code *)0x1b2f89;
        uv_poll_start(puVar2,2,connection_poll_cb);
        *(undefined4 *)((long)&puVar2[2].handle_queue.next + 4) = 2;
        break;
      default:
        goto switchD_001b2c49_default;
      }
switchD_001b2c49_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)&puVar2[2].handle_queue.next = 1;
        disconnects = disconnects + 1;
        uVar11 = uVar11 & 0xfffffffb;
      }
      if (((*(int *)&puVar2[2].close_cb == 0) || (*(int *)((long)&puVar2[2].close_cb + 4) == 0)) ||
         (*(int *)&puVar2[2].handle_queue.next == 0)) {
        if (uVar11 != *(uint *)((long)&puVar2[2].handle_queue.next + 4)) {
          *(uint *)((long)&puVar2[2].handle_queue.next + 4) = uVar11;
          pcStack_b0 = (code *)0x1b2aea;
          uv_poll_start((uv_poll_t *)puVar5,uVar11,connection_poll_cb);
          uVar11 = *(uint *)((long)&puVar2[2].handle_queue.next + 4);
        }
        if (uVar11 != 0) {
          pvStack_98 = (void *)0x1;
          pcStack_b0 = (code *)0x1b2b06;
          iVar3 = uv_is_active((uv_handle_t *)puVar5);
          pvStack_a0 = (void *)(long)iVar3;
          if (pvStack_98 == pvStack_a0) {
            return;
          }
          pcStack_b0 = (code *)0x1b2b28;
          connection_poll_cb_cold_17();
        }
      }
      else {
        pcStack_b0 = (code *)0x1b2a9b;
        close_socket(puVar2[1].io_watcher.fd);
        pcStack_b0 = (code *)0x1b2aad;
        uv_close((uv_handle_t *)puVar2,connection_close_cb);
        pcStack_b0 = (code *)0x1b2abc;
        uv_close((uv_handle_t *)(puVar2 + 1),connection_close_cb);
        *(undefined4 *)((long)&puVar2[2].handle_queue.next + 4) = 0;
      }
      pcStack_b0 = (code *)0x1b2b30;
      iVar3 = uv_is_active((uv_handle_t *)puVar5);
      pvStack_98 = (void *)(long)iVar3;
      pvStack_a0 = (void *)0x0;
      if (pvStack_98 == (void *)0x0) {
        return;
      }
      goto LAB_001b302c;
    }
    pcStack_b0 = (code *)0x1b2a29;
    iVar3 = shutdown(puVar2[1].io_watcher.fd,1);
    pvStack_98 = (void *)(long)iVar3;
    pvStack_a0 = (void *)0x0;
    if (pvStack_98 == (void *)0x0) {
      *(undefined4 *)((long)&puVar2[2].close_cb + 4) = 1;
      uVar11 = uVar11 & 0xfffffffd;
      pvStack_98 = (void *)0x0;
      goto switchD_001b2c49_caseD_4;
    }
  }
  else {
LAB_001b3013:
    pcStack_b0 = (code *)0x1b3022;
    connection_poll_cb_cold_1();
LAB_001b3022:
    pcStack_b0 = (code *)0x1b3027;
    connection_poll_cb_cold_19();
LAB_001b3027:
    puVar5 = puVar6;
    pcStack_b0 = (code *)0x1b302c;
    connection_poll_cb_cold_2();
LAB_001b302c:
    pcStack_b0 = (code *)0x1b303b;
    connection_poll_cb_cold_18();
  }
  pcStack_b0 = (code *)0x1b304a;
  connection_poll_cb_cold_6();
LAB_001b304a:
  pcStack_b0 = (code *)0x1b304f;
  connection_poll_cb_cold_10();
LAB_001b304f:
  pcStack_b0 = (code *)0x1b305e;
  connection_poll_cb_cold_4();
switchD_001b2ba0_default:
  pcStack_b0 = (code *)0x1b3063;
  connection_poll_cb_cold_5();
LAB_001b3063:
  pcStack_b0 = (code *)0x1b3072;
  connection_poll_cb_cold_13();
LAB_001b3072:
  pcStack_b0 = (code *)0x1b3081;
  connection_poll_cb_cold_7();
switchD_001b2c49_default:
  pcStack_b0 = (code *)0x1b3086;
  connection_poll_cb_cold_16();
LAB_001b3086:
  pcStack_b0 = (code *)0x1b308b;
  connection_poll_cb_cold_12();
LAB_001b308b:
  pcStack_b0 = (code *)0x1b309a;
  connection_poll_cb_cold_14();
LAB_001b309a:
  pcStack_b0 = (code *)0x1b30a9;
  connection_poll_cb_cold_8();
LAB_001b30a9:
  handle_01 = (uv_handle_t *)&pvStack_98;
  pcStack_b0 = close_socket;
  connection_poll_cb_cold_9();
  puStack_b8 = (uv_loop_t *)0x1b30be;
  iVar3 = close((int)handle_01);
  if (iVar3 == 0) {
    return;
  }
  puStack_b8 = (uv_loop_t *)0x1b30c7;
  piVar9 = __errno_location();
  if (*piVar9 == 0x68) {
    return;
  }
  puStack_b8 = (uv_loop_t *)delay_timer_cb;
  close_socket_cold_1();
  puVar2 = (uv_poll_t *)handle_01->data;
  pcStack_d0 = (code *)0x1b30e0;
  puStack_b8 = puVar5;
  iVar3 = uv_is_active(handle_01);
  lStack_c0 = (long)iVar3;
  uStack_c8 = 0;
  if (lStack_c0 == 0) {
    uVar11 = *(uint *)&puVar2[2].handle_queue.prev;
    if (uVar11 == 0) goto LAB_001b3156;
    uVar11 = uVar11 | *(uint *)((long)&puVar2[2].handle_queue.next + 4);
    *(uint *)((long)&puVar2[2].handle_queue.next + 4) = uVar11;
    *(undefined4 *)&puVar2[2].handle_queue.prev = 0;
    pcStack_d0 = (code *)0x1b3129;
    iVar3 = uv_poll_start(puVar2,uVar11,connection_poll_cb);
    lStack_c0 = (long)iVar3;
    uStack_c8 = 0;
    if (lStack_c0 == 0) {
      return;
    }
  }
  else {
    pcStack_d0 = (code *)0x1b3156;
    delay_timer_cb_cold_1();
LAB_001b3156:
    pcStack_d0 = (code *)0x1b315b;
    delay_timer_cb_cold_3();
  }
  plVar13 = &lStack_c0;
  pcStack_d0 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar14 = (code **)*plVar13;
  piVar9 = (int *)((long)ppcVar14 + 0x114);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    if (*(int *)(ppcVar14 + 0x22) != 0) {
      pcStack_d0 = ppcVar14[0x20];
      if (pcStack_d0 == (code *)0x10000) {
        pcStack_d0 = ppcVar14[0x21];
        if (pcStack_d0 == (code *)0x0) goto LAB_001b3259;
        ppcVar14 = &pcStack_d0;
        connection_close_cb_cold_2();
        goto LAB_001b31e7;
      }
      goto LAB_001b3208;
    }
LAB_001b3217:
    pcStack_d0 = ppcVar14[0x20];
    if (pcStack_d0 != (code *)0x0) goto LAB_001b3277;
  }
  else {
LAB_001b31e7:
    pcStack_d0 = ppcVar14[0x20];
    if (pcStack_d0 != (code *)0x10000) {
LAB_001b3208:
      ppcVar14 = &pcStack_d0;
      connection_close_cb_cold_1();
      goto LAB_001b3217;
    }
  }
  pcStack_d0 = ppcVar14[0x21];
  if (pcStack_d0 == (code *)0x10000) {
LAB_001b3259:
    closed_connections = closed_connections + 1;
    free(ppcVar14);
    return;
  }
  connection_close_cb_cold_4();
LAB_001b3277:
  ppcVar14 = &pcStack_d0;
  connection_close_cb_cold_3();
  free(*ppcVar14);
  return;
joined_r0x001b2e9b:
  if ((uv_loop_t *)0xffff < puVar6) goto switchD_001b2c49_caseD_4;
  pvVar15 = (void *)(0x10000 - (long)puVar6);
  if (puVar6 < (uv_loop_t *)0xfb2f) {
    pvVar15 = (void *)0x4d2;
  }
  pvStack_a0 = (void *)0x0;
  pvStack_98 = pvVar15;
  if ((long)pvVar15 < 1) goto LAB_001b30a9;
  while( true ) {
    pcStack_b0 = (code *)0x1b2ef2;
    sVar8 = send(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_3,(size_t)pvVar15,0);
    uVar4 = (uint)sVar8;
    if (uVar4 != 0xffffffff) break;
    pcStack_b0 = (code *)0x1b2efc;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    if (iVar3 != 4) goto LAB_001b2ffc;
  }
  if (uVar4 == 0) goto LAB_001b304a;
  if ((int)uVar4 < 0) {
    pcStack_b0 = (code *)0x1b2ffa;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
LAB_001b2ffc:
    if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
      pcStack_b0 = (code *)0x1b3013;
      connection_poll_cb_cold_11();
      puVar6 = puVar5;
      goto LAB_001b3013;
    }
    goto switchD_001b2c49_caseD_4;
  }
  puVar6 = (uv_loop_t *)((long)(puVar2[2].loop)->reserved + ((ulong)(uVar4 & 0x7fffffff) - 0x38));
  puVar2[2].loop = puVar6;
  goto joined_r0x001b2e9b;
}

Assistant:

static void server_poll_cb(uv_poll_t* handle, int status, int events) {
  server_context_t* server_context = (server_context_t*)
                                          handle->data;
  connection_context_t* connection_context;
  struct sockaddr_in addr;
  socklen_t addr_len;
  uv_os_sock_t sock;
  int r;

  addr_len = sizeof addr;
  sock = accept(server_context->sock, (struct sockaddr*) &addr, &addr_len);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

  connection_context = create_connection_context(sock, 1);
  connection_context->events = UV_READABLE | UV_WRITABLE | UV_DISCONNECT;
  r = uv_poll_start(&connection_context->poll_handle,
                    UV_READABLE | UV_WRITABLE | UV_DISCONNECT,
                    connection_poll_cb);
  ASSERT_OK(r);

  if (++server_context->connections == NUM_CLIENTS) {
    close_socket(server_context->sock);
    destroy_server_context(server_context);
  }
}